

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
jessilib::json_parser::serialize_impl<char32_t,char>
          (json_parser *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
          object *in_object)

{
  bool bVar1;
  int iVar2;
  type tVar3;
  char32_t *pcVar4;
  size_type sVar5;
  vector<jessilib::object,_std::allocator<jessilib::object>_> *this_00;
  reference in_object_00;
  size_t sVar6;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  *this_01;
  size_type sVar7;
  invalid_argument *this_02;
  uint *puVar8;
  array_type *paVar9;
  map_type *this_03;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar10;
  u8string_view in_string;
  u8string_view in_string_00;
  u8string_view in_string_01;
  u8string_view in_string_02;
  u8string_view in_string_03;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __sv_type local_178;
  reference local_168;
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  *item;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  *__range3_1;
  char8_t *local_140;
  object *obj;
  const_iterator __end3;
  const_iterator __begin3;
  vector<jessilib::object,_std::allocator<jessilib::object>_> *__range3;
  char8_t *local_110;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_108;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_e8;
  __sv_type local_c8;
  longdouble local_b8;
  undefined1 local_a8 [8];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> encoded_1;
  long local_78;
  undefined1 local_70 [8];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> encoded;
  char8_t *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char8_t *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char8_t *local_28;
  object *in_object_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string_local;
  json_parser *this_local;
  
  this_03 = (map_type *)out_string;
  if ((serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)::s_null_array ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)
                                   ::s_null_array), iVar2 != 0)) {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              (&serialize_impl<char32_t,_char>::s_null_array);
    paVar9 = &serialize_impl<char32_t,_char>::s_null_array;
    __cxa_atexit(std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector,
                 &serialize_impl<char32_t,_char>::s_null_array,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_array);
    this_03 = (map_type *)paVar9;
  }
  if ((serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)::
       s_null_map_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)
                                   ::s_null_map_abi_cxx11_), iVar2 != 0)) {
    std::
    map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
    ::map(&serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)::
           s_null_map_abi_cxx11_);
    this_03 = &serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)::
               s_null_map_abi_cxx11_;
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                 ::~map,&serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_);
  }
  tVar3 = object::type(in_object);
  puVar8 = &switchD_002befa2::switchdataD_002d0f1c;
  switch(tVar3) {
  case null:
    bVar10 = sv("null",4);
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar10._M_len;
    local_28 = bVar10._M_str;
    in_string._M_str = (char8_t *)puVar8;
    in_string._M_len = (size_t)local_28;
    simple_append<char32_t,char>((jessilib *)out_string,local_30,in_string);
    break;
  case boolean:
    bVar1 = object::get<bool,_nullptr>(in_object,false);
    if (bVar1) {
      bVar10 = sv("true",4);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar10._M_len;
      local_38 = bVar10._M_str;
      in_string_00._M_str = (char8_t *)puVar8;
      in_string_00._M_len = (size_t)local_38;
      simple_append<char32_t,char>((jessilib *)out_string,local_40,in_string_00);
    }
    else {
      join_0x00000010_0x00000000_ = sv("false",5);
      in_string_01._M_str = (char8_t *)puVar8;
      in_string_01._M_len = (size_t)local_48;
      simple_append<char32_t,char>
                ((jessilib *)out_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 encoded.field_2._8_8_,in_string_01);
    }
    break;
  case integer:
    local_78 = object::get<long,_nullptr>(in_object,0);
    fmt::v8::format<char32_t[3],_long,_char32_t,_0>
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_70,(char32_t (*) [3])empty_format_arg<char32_t>,&local_78);
    pcVar4 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::data
                       ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_70);
    sVar5 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)local_70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out_string,(char *)pcVar4,sVar5 << 2);
    std::__cxx11::u32string::~u32string((u32string *)local_70);
    break;
  case decimal:
    object::get<long_double,_nullptr>((longdouble *)in_object,(object *)this_03,(longdouble)0);
    fmt::v8::format<char32_t[3],_long_double,_char32_t,_0>
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_a8,(char32_t (*) [3])empty_format_arg<char32_t>,&local_b8);
    pcVar4 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::data
                       ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_a8);
    sVar5 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)local_a8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out_string,(char *)pcVar4,sVar5 << 2);
    std::__cxx11::u32string::~u32string((u32string *)local_a8);
    break;
  case text:
    std::__cxx11::u8string::u8string((u8string *)&local_108);
    object::
    get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
              (&local_e8,in_object,&local_108);
    local_c8 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)&local_e8);
    make_json_string<char32_t,char>(out_string,local_c8);
    std::__cxx11::u8string::~u8string((u8string *)&local_e8);
    std::__cxx11::u8string::~u8string((u8string *)&local_108);
    break;
  default:
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    tVar3 = object::type(in_object);
    std::__cxx11::to_string(&local_1b8,tVar3);
    std::operator+(&local_198,"Invalid data type: ",&local_1b8);
    std::invalid_argument::invalid_argument(this_02,(string *)&local_198);
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case array:
    sVar6 = object::size(in_object);
    if (sVar6 == 0) {
      bVar10 = sv("[]",2);
      __range3 = (vector<jessilib::object,_std::allocator<jessilib::object>_> *)bVar10._M_len;
      local_110 = bVar10._M_str;
      in_string_02._M_str = (char8_t *)puVar8;
      in_string_02._M_len = (size_t)local_110;
      simple_append<char32_t,char>
                ((jessilib *)out_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__range3,
                 in_string_02);
    }
    simple_append<char32_t,char>(out_string,'[');
    this_00 = object::get<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
                        (in_object,&serialize_impl<char32_t,_char>::s_null_array);
    __end3 = std::vector<jessilib::object,_std::allocator<jessilib::object>_>::begin(this_00);
    obj = (object *)std::vector<jessilib::object,_std::allocator<jessilib::object>_>::end(this_00);
    while (bVar1 = __gnu_cxx::
                   operator==<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                             (&__end3,(__normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                                       *)&obj), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_object_00 = __gnu_cxx::
                     __normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                     ::operator*(&__end3);
      serialize_impl<char32_t,char>(this,out_string,in_object_00);
      simple_append<char32_t,char>(out_string,',');
      __gnu_cxx::
      __normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
      ::operator++(&__end3);
    }
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (out_string);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (out_string,sVar7 - 4,0xffffffffffffffff);
    simple_append<char32_t,char>(out_string,']');
    break;
  case map:
    sVar6 = object::size(in_object);
    if (sVar6 == 0) {
      bVar10 = sv("{}",2);
      __range3_1 = (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                    *)bVar10._M_len;
      local_140 = bVar10._M_str;
      in_string_03._M_str = (char8_t *)puVar8;
      in_string_03._M_len = (size_t)local_140;
      simple_append<char32_t,char>
                ((jessilib *)out_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__range3_1,
                 in_string_03);
    }
    simple_append<char32_t,char>(out_string,'{');
    this_01 = object::
              get<std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>,_nullptr>
                        (in_object,
                         &serialize_impl<char32_t,char>(std::__cxx11::string&,jessilib::object_const&)
                          ::s_null_map_abi_cxx11_);
    __end3_1 = std::
               map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
               ::begin(this_01);
    item = (pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
            *)std::
              map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              ::end(this_01);
    while (bVar1 = std::operator==(&__end3_1,(_Self *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_168 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
                  ::operator*(&__end3_1);
      local_178 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)local_168);
      make_json_string<char32_t,char>(out_string,local_178);
      simple_append<char32_t,char>(out_string,':');
      serialize_impl<char32_t,char>(this,out_string,&local_168->second);
      simple_append<char32_t,char>(out_string,',');
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
      ::operator++(&__end3_1);
    }
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (out_string);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (out_string,sVar7 - 4,0xffffffffffffffff);
    simple_append<char32_t,char>(out_string,'}');
  }
  return;
}

Assistant:

void json_parser::serialize_impl(std::basic_string<ResultCharT>& out_string, const object& in_object) {
	using namespace std::literals;
	static const object::array_type s_null_array;
	static const object::map_type s_null_map;

	switch (in_object.type()) {
		case object::type::null:
			simple_append<CharT, ResultCharT>(out_string, u8"null"sv);
			return;

		case object::type::boolean:
			if (in_object.get<bool>()) {
				simple_append<CharT, ResultCharT>(out_string, u8"true"sv);
				return;
			}
			simple_append<CharT, ResultCharT>(out_string, u8"false"sv);
			return;

		case object::type::integer:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<intmax_t>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<intmax_t>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::decimal:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<long double>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<long double>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::text:
			make_json_string<CharT, ResultCharT>(out_string, in_object.get<std::u8string>());
			return;

		case object::type::array: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"[]"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '[');

			// Serialize all objects in array
			for (auto& obj : in_object.get<object::array_type>(s_null_array)) {
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, obj);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with ']'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = ']';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, ']');
			}
			// else // not supported
			return;
		}

		case object::type::map: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"{}"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '{');

			// Serialize all objects in map
			for (auto& item : in_object.get<object::map_type>(s_null_map)) {
				make_json_string<CharT, ResultCharT>(out_string, item.first);
				simple_append<CharT, ResultCharT>(out_string, ':');
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, item.second);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with '}'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = '}';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, '}');
			}
			// else // not supported
			return;
		}

		default:
			throw std::invalid_argument{ "Invalid data type: " + std::to_string(static_cast<size_t>(in_object.type())) };
	}
}